

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::PrintStatementSourceLine(FunctionBody *this,uint statementIndex)

{
  uint cchStartOffset;
  
  if ((((this->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46 & 8) == 0) &&
     ((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->field_0xa8 &
      4) == 0)) {
    cchStartOffset = GetStatementStartOffset(this,statementIndex);
    if (statementIndex == 0 || cchStartOffset != 0) {
      PrintStatementSourceLineFromStartOffset(this,cchStartOffset);
      return;
    }
  }
  return;
}

Assistant:

void FunctionBody::PrintStatementSourceLine(uint statementIndex)
    {
        if (m_isWasmFunction || this->GetUtf8SourceInfo()->GetIsLibraryCode())
        {
            // currently no source view support for wasm
            return;
        }

        const uint startOffset = GetStatementStartOffset(statementIndex);

        // startOffset should only be 0 if statementIndex is 0, otherwise it is EOF and we should skip printing anything
        if (startOffset != 0 || statementIndex == 0)
        {
            PrintStatementSourceLineFromStartOffset(startOffset);
        }
    }